

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeOpen(sqlite3_vfs *pVfs,char *zFilename,sqlite3 *db,Btree **ppBtree,int flags,
                    int vfsFlags)

{
  char cVar1;
  sqlite3_file *psVar2;
  sqlite3_io_methods *psVar3;
  PCache *pCache;
  long lVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Btree *p;
  BtShared *__s;
  size_t sVar11;
  Btree *pBVar12;
  size_t sVar13;
  size_t sVar14;
  long lVar15;
  Btree *pBVar16;
  void *pvVar17;
  Pager *pPVar18;
  sqlite3_mutex *psVar19;
  sqlite3_mutex *psVar20;
  uint uVar21;
  Btree **ppBVar22;
  code *pcVar23;
  long lVar24;
  Btree *pBVar25;
  u8 uVar26;
  u64 n;
  char *__dest;
  byte bVar27;
  char *__s_00;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  char *pcVar32;
  bool bVar33;
  bool bVar34;
  uchar zDbHeader [100];
  sqlite3_mutex *local_128;
  Pager *local_110;
  char *local_f8;
  u8 local_d0;
  uint local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  if (zFilename == (char *)0x0) {
    bVar34 = true;
LAB_00147db9:
    if ((!bVar34) || (uVar10 = 1, db->temp_store != '\x02')) {
      uVar10 = (uint)vfsFlags >> 7 & 1;
    }
  }
  else {
    bVar34 = *zFilename == '\0';
    iVar6 = strcmp(zFilename,":memory:");
    if (iVar6 != 0) goto LAB_00147db9;
    uVar10 = 1;
  }
  bVar5 = (byte)uVar10;
  uVar21 = flags | 2;
  if (uVar10 == 0) {
    uVar21 = flags;
  }
  uVar10 = vfsFlags & 0xfffffcffU | 0x200;
  if (bVar5 == 0 && !bVar34) {
    uVar10 = vfsFlags;
  }
  if ((vfsFlags & 0x100U) == 0) {
    uVar10 = vfsFlags;
  }
  p = (Btree *)sqlite3Malloc(0x48);
  if (p == (Btree *)0x0) {
    return 7;
  }
  p->db = (sqlite3 *)0x0;
  p->pBt = (BtShared *)0x0;
  (p->lock).pBtree = (Btree *)0x0;
  (p->lock).iTable = 0;
  (p->lock).eLock = '\0';
  *(undefined3 *)&(p->lock).field_0xd = 0;
  p->pNext = (Btree *)0x0;
  p->pPrev = (Btree *)0x0;
  p->inTrans = '\0';
  p->sharable = '\0';
  p->locked = '\0';
  p->hasIncrblobCur = '\0';
  p->wantToLock = 0;
  p->nBackup = 0;
  p->iBDataVersion = 0;
  (p->lock).pNext = (BtLock *)0x0;
  p->db = db;
  (p->lock).pBtree = p;
  (p->lock).iTable = 1;
  if ((!bVar34) && ((uVar10 >> 0x11 & 1) != 0 && ((uVar10 & 0x40) == 0 & bVar5) == 0)) {
    if (zFilename == (char *)0x0) {
      uVar7 = 1;
    }
    else {
      sVar11 = strlen(zFilename);
      uVar7 = ((uint)sVar11 & 0x3fffffff) + 1;
    }
    uVar8 = pVfs->mxPathname + 1;
    uVar29 = uVar7;
    if ((int)uVar7 < (int)uVar8) {
      uVar29 = uVar8;
    }
    pBVar12 = (Btree *)sqlite3Malloc((ulong)uVar29);
    p->sharable = '\x01';
    if (pBVar12 != (Btree *)0x0) {
      if (bVar5 == 0) {
        *(undefined1 *)&pBVar12->db = 0;
        uVar7 = (*pVfs->xFullPathname)(pVfs,zFilename,uVar8,(char *)pBVar12);
        if ((uVar7 & 0xfffffdff) != 0) {
          sqlite3_free(pBVar12);
          bVar34 = false;
          local_128 = (sqlite3_mutex *)0x0;
          __s = (BtShared *)0x0;
          pBVar12 = p;
          uVar29 = uVar7;
          goto LAB_0014876f;
        }
      }
      else {
        memcpy(pBVar12,zFilename,(ulong)uVar7);
      }
      if (sqlite3Config.bCoreMutex == '\0') {
        local_128 = (sqlite3_mutex *)0x0;
      }
      else {
        local_128 = (*sqlite3Config.mutex.xMutexAlloc)(4);
      }
      if (local_128 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(local_128);
      }
      if (sqlite3Config.bCoreMutex == '\0') {
        psVar19 = (sqlite3_mutex *)0x0;
      }
      else {
        psVar19 = (*sqlite3Config.mutex.xMutexAlloc)(2);
      }
      __s = sqlite3SharedCacheList;
      if (psVar19 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(psVar19);
        __s = sqlite3SharedCacheList;
      }
      for (; __s != (BtShared *)0x0; __s = __s->pNext) {
        pPVar18 = __s->pPager;
        iVar6 = strcmp((char *)pBVar12,pPVar18->zFilename);
        if ((iVar6 == 0) && (pPVar18->pVfs == pVfs)) {
          lVar24 = (long)db->nDb;
          bVar34 = lVar24 < 1;
          if (lVar24 < 1) goto LAB_001483a6;
          ppBVar22 = &db->aDb[lVar24 + -1].pBt;
          lVar24 = lVar24 + 1;
          goto LAB_00148383;
        }
      }
      goto LAB_0014874f;
    }
    uVar7 = 7;
    bVar34 = false;
    uVar29 = 0;
    local_128 = (sqlite3_mutex *)0x0;
    __s = (BtShared *)0x0;
    pBVar12 = p;
    goto LAB_0014876f;
  }
  uVar29 = 0;
  local_128 = (sqlite3_mutex *)0x0;
  __s = (BtShared *)0x0;
  goto LAB_00147e76;
LAB_00147ecc:
  do {
    pBVar16 = pBVar12;
    pBVar12 = pBVar16->pPrev;
  } while (pBVar16->pPrev != (Btree *)0x0);
  if (p->pBt < pBVar16->pBt) {
    p->pNext = pBVar16;
    ppBVar22 = &pBVar16->pPrev;
    p->pPrev = (Btree *)0x0;
  }
  else {
    do {
      pBVar12 = pBVar16;
      pBVar16 = pBVar12->pNext;
      if (pBVar16 == (Btree *)0x0) {
        p->pNext = (Btree *)0x0;
        pBVar16 = p;
        pBVar25 = pBVar12;
        goto LAB_001483bd;
      }
    } while (pBVar16->pBt < p->pBt);
    p->pNext = pBVar16;
    p->pPrev = pBVar12;
    pBVar25 = p;
    if (pBVar16 != (Btree *)0x0) {
LAB_001483bd:
      pBVar16->pPrev = pBVar25;
    }
    ppBVar22 = &pBVar12->pNext;
  }
  *ppBVar22 = p;
  goto LAB_001483c8;
  while( true ) {
    lVar15 = lVar24 + -1;
    ppBVar22 = ppBVar22 + -4;
    lVar4 = lVar24 + -3;
    bVar34 = lVar15 < 2;
    lVar24 = lVar15;
    if (SBORROW8(lVar15,2) != lVar4 < 0) break;
LAB_00148383:
    if ((*ppBVar22 != (Btree *)0x0) && ((*ppBVar22)->pBt == __s)) {
      if (psVar19 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar19);
      }
      if (local_128 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(local_128);
      }
      sqlite3_free(pBVar12);
      sqlite3_free(p);
      goto LAB_00148749;
    }
  }
LAB_001483a6:
  p->pBt = __s;
  __s->nRef = __s->nRef + 1;
LAB_00148749:
  if (bVar34) {
LAB_0014874f:
    uVar7 = 0x13;
    bVar34 = true;
    uVar29 = 0;
    if (psVar19 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar19);
    }
LAB_0014876f:
    sqlite3_free(pBVar12);
  }
  else {
    uVar7 = 0x13;
    bVar34 = false;
    uVar29 = 0;
  }
  if (!bVar34) {
    return uVar7;
  }
LAB_00147e76:
  if (__s == (BtShared *)0x0) {
    __s = (BtShared *)sqlite3Malloc(0x98);
    if (__s == (BtShared *)0x0) {
      uVar29 = 7;
      __s = (BtShared *)0x0;
      goto LAB_001483d3;
    }
    memset(__s,0,0x98);
    local_98 = CONCAT44(local_98._4_4_,0x1000);
    iVar6 = 0x50;
    if (0x50 < pVfs->szOsFile) {
      iVar6 = pVfs->szOsFile;
    }
    __s->pPager = (Pager *)0x0;
    uVar7 = uVar21 & 2;
    if (uVar7 == 0) {
      local_d0 = '\0';
LAB_00148032:
      local_110 = (Pager *)0x0;
      uVar8 = 0;
      __s_00 = zFilename;
LAB_0014817a:
      iVar31 = 1;
      if ((__s_00 == (char *)0x0) || (*__s_00 == '\0')) {
        local_f8 = (char *)0x0;
        uVar30 = 0;
      }
      else {
        uVar8 = pVfs->mxPathname + 1;
        local_110 = (Pager *)sqlite3Malloc((long)pVfs->mxPathname * 2 + 2);
        uVar30 = 0;
        if (local_110 == (Pager *)0x0) {
          uVar29 = 7;
          iVar31 = 1;
          local_f8 = (char *)0x0;
          bVar34 = false;
        }
        else {
          *(char *)&local_110->pVfs = '\0';
          uVar8 = (*pVfs->xFullPathname)(pVfs,__s_00,uVar8,(char *)local_110);
          uVar29 = (int)(uVar10 << 7) >> 0x1f & 0x60e;
          if (uVar8 != 0x200) {
            uVar29 = uVar8;
          }
          sVar11 = strlen((char *)local_110);
          sVar13 = strlen(__s_00);
          local_f8 = __s_00 + (ulong)((uint)sVar13 & 0x3fffffff) + 1;
          cVar1 = *local_f8;
          pcVar32 = local_f8;
          while (cVar1 != '\0') {
            sVar13 = strlen(pcVar32);
            sVar14 = strlen(pcVar32 + sVar13 + 1);
            pcVar32 = pcVar32 + sVar14 + sVar13 + 2;
            cVar1 = *pcVar32;
          }
          uVar8 = (uint)sVar11 & 0x3fffffff;
          if ((uVar29 == 0) && (uVar29 = 0, pVfs->mxPathname < (int)(uVar8 + 8))) {
            uVar29 = 0xe;
            sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xe9ec,
                        "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
          }
          uVar30 = 0;
          iVar31 = ((int)pcVar32 - (int)local_f8) + 1;
          if (uVar29 == 0) {
            bVar34 = true;
          }
          else {
            sqlite3_free(local_110);
            bVar34 = false;
            uVar30 = uVar29;
          }
        }
        if (!bVar34) goto LAB_001489d2;
      }
      uVar29 = uVar30;
      uVar28 = (ulong)(iVar6 + 7U & 0x7ffffff8);
      sVar11 = (size_t)(int)uVar8;
      sVar13 = (size_t)iVar31;
      n = ((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) + sVar11 * 3 + uVar28 * 2 + sVar13 +
          0x19e;
      pPVar18 = (Pager *)sqlite3Malloc(n);
      if (pPVar18 == (Pager *)0x0) {
        uVar29 = 7;
        if (local_110 == (Pager *)0x0) goto LAB_001489d2;
      }
      else {
        memset(pPVar18,0,n);
        pPVar18->pPCache = (PCache *)(pPVar18 + 1);
        pPVar18->fd = (sqlite3_file *)&pPVar18[1].fd;
        pcVar32 = pPVar18[1].dbFileVers + (((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) - 0x40);
        pPVar18->sjfd = (sqlite3_file *)pcVar32;
        pcVar32 = pcVar32 + uVar28;
        pPVar18->jfd = (sqlite3_file *)pcVar32;
        __dest = pcVar32 + uVar28 + 0xc;
        *(Pager **)(pcVar32 + uVar28) = pPVar18;
        pPVar18->zFilename = __dest;
        if (0 < (int)uVar8) {
          memcpy(__dest,local_110,sVar11);
          if (local_f8 == (char *)0x0) {
            __dest = __dest + sVar11 + 2;
          }
          else {
            memcpy(__dest + sVar11 + 1,local_f8,sVar13);
            __dest = __dest + sVar13 + sVar11 + 1;
          }
        }
        if ((int)uVar8 < 1) {
          pPVar18->zJournal = (char *)0x0;
          pPVar18->zWal = (char *)0x0;
        }
        else {
          pPVar18->zJournal = __dest;
          memcpy(__dest,local_110,sVar11);
          pcVar32 = __dest + sVar11;
          *(undefined8 *)pcVar32 = 0x6c616e72756f6a2d;
          pPVar18->zWal = pcVar32 + 9;
          memcpy(pcVar32 + 9,local_110,sVar11);
          builtin_strncpy(__dest + sVar11 + sVar11 + 9,"-wal",4);
        }
        if ((local_110 != (Pager *)0x0) && (uVar8 != 0)) {
          sqlite3_free(local_110);
        }
        pPVar18->pVfs = pVfs;
        pPVar18->vfsFlags = uVar10;
        if ((__s_00 == (char *)0x0) || (*__s_00 == '\0')) {
          uVar8 = 0;
LAB_00148826:
          pPVar18->eState = '\x01';
          pPVar18->eLock = '\x04';
          pPVar18->noLock = '\x01';
          bVar27 = (byte)uVar10 & 1;
          uVar26 = '\x01';
          bVar34 = false;
        }
        else {
          local_9c = 0;
          uVar29 = (*pVfs->xOpen)(pVfs,pPVar18->zFilename,pPVar18->fd,uVar10 & 0x1087f7f,
                                  (int *)&local_9c);
          uVar8 = local_9c >> 7 & 1;
          pPVar18->memVfs = (byte)(local_9c >> 7) & 1;
          uVar30 = local_9c & 1;
          bVar27 = (byte)uVar30;
          bVar34 = true;
          if (uVar29 == 0) {
            psVar3 = pPVar18->fd->pMethods;
            if (psVar3 == (sqlite3_io_methods *)0x0) {
              bVar33 = true;
            }
            else {
              uVar9 = (*psVar3->xDeviceCharacteristics)(pPVar18->fd);
              bVar33 = (uVar9 >> 0xd & 1) == 0;
            }
            if (uVar30 == 0) {
              setSectorSize(pPVar18);
              uVar30 = pPVar18->sectorSize;
              if ((uint)local_98 < uVar30) {
                if (uVar30 < 0x2001) {
                  local_98 = CONCAT44(local_98._4_4_,uVar30);
                }
                else {
                  local_98 = CONCAT44(local_98._4_4_,0x2000);
                }
              }
            }
            iVar6 = sqlite3_uri_boolean(pPVar18->zFilename,"nolock",0);
            pPVar18->noLock = (u8)iVar6;
            if ((bVar33) &&
               (iVar6 = sqlite3_uri_boolean(pPVar18->zFilename,"immutable",0), iVar6 == 0)) {
              bVar33 = true;
            }
            else {
              uVar10 = 1;
              bVar33 = false;
            }
          }
          else {
            bVar33 = true;
          }
          if (!bVar33) goto LAB_00148826;
          uVar26 = '\0';
        }
        if (uVar29 == 0) {
          uVar29 = sqlite3PagerSetPagesize(pPVar18,(u32 *)&local_98,-1);
        }
        if (uVar29 == 0) {
          pcVar23 = (_func_int_void_ptr_PgHdr_ptr *)0x0;
          if (uVar7 == 0) {
            pcVar23 = pagerStress;
          }
          pCache = pPVar18->pPCache;
          pCache->szSpill = 0;
          pCache->szPage = 0;
          pCache->szExtra = 0;
          pCache->bPurgeable = '\0';
          pCache->eCreate = '\0';
          *(undefined2 *)&pCache->field_0x2e = 0;
          pCache->xStress = (_func_int_void_ptr_PgHdr_ptr *)0x0;
          pCache->pStress = (void *)0x0;
          pCache->pSynced = (PgHdr *)0x0;
          pCache->nRefSum = 0;
          pCache->szCache = 0;
          pCache->pDirty = (PgHdr *)0x0;
          pCache->pDirtyTail = (PgHdr *)0x0;
          pCache->pCache = (sqlite3_pcache *)0x0;
          pCache->szExtra = 0x88;
          pCache->bPurgeable = (byte)(uVar7 >> 1) ^ 1;
          pCache->eCreate = '\x02';
          pCache->xStress = pcVar23;
          pCache->pStress = pPVar18;
          pCache->szCache = 100;
          pCache->szSpill = 1;
          pCache->szPage = 1;
          uVar29 = sqlite3PcacheSetPageSize(pCache,(uint)local_98);
        }
        if (uVar29 == 0) {
          pPVar18->useJournal = (byte)(uVar21 & 1) ^ 1;
          pPVar18->mxPgno = 0x3fffffff;
          pPVar18->tempFile = uVar26;
          pPVar18->exclusiveMode = uVar26;
          pPVar18->changeCountDone = uVar26;
          pPVar18->memDb = local_d0;
          pPVar18->readOnly = bVar27;
          pPVar18->noSync = uVar26;
          if (bVar34) {
            pPVar18->fullSync = '\x01';
            pPVar18->extraSync = '\0';
            pPVar18->syncFlags = '\x02';
            pPVar18->walSyncFlags = '\n';
          }
          pPVar18->nExtra = 0x88;
          pPVar18->journalSizeLimit = -1;
          setSectorSize(pPVar18);
          uVar26 = '\x02';
          if (((uVar21 & 1) != 0) || (uVar26 = '\x04', uVar7 != 0 || uVar8 != 0)) {
            pPVar18->journalMode = uVar26;
          }
          pPVar18->xReiniter = pageReinit;
          if (pPVar18->errCode == 0) {
            if (pPVar18->bUseFetch == '\0') {
              pcVar23 = getPageNormal;
            }
            else {
              pcVar23 = getPageMMap;
            }
          }
          else {
            pcVar23 = getPageError;
          }
          pPVar18->xGet = pcVar23;
          __s->pPager = pPVar18;
          uVar29 = 0;
          goto LAB_001489d2;
        }
        psVar2 = pPVar18->fd;
        if (psVar2->pMethods != (sqlite3_io_methods *)0x0) {
          (*psVar2->pMethods->xClose)(psVar2);
          psVar2->pMethods = (sqlite3_io_methods *)0x0;
        }
        pcache1Free(pPVar18->pTmpSpace);
        local_110 = pPVar18;
      }
      sqlite3_free(local_110);
    }
    else {
      if (zFilename == (char *)0x0) {
        local_d0 = '\x01';
        local_110 = (Pager *)0x0;
        uVar8 = 0;
        __s_00 = (char *)0x0;
        goto LAB_0014817a;
      }
      if (*zFilename == '\0') {
        local_d0 = '\x01';
        goto LAB_00148032;
      }
      local_110 = (Pager *)sqlite3DbStrDup((sqlite3 *)0x0,zFilename);
      if (local_110 != (Pager *)0x0) {
        local_d0 = '\x01';
        sVar11 = strlen((char *)local_110);
        uVar8 = (uint)sVar11 & 0x3fffffff;
        __s_00 = (char *)0x0;
        goto LAB_0014817a;
      }
      uVar29 = 7;
    }
LAB_001489d2:
    if (uVar29 == 0) {
      pPVar18 = __s->pPager;
      pPVar18->szMmap = db->szMmap;
      pagerFixMaplimit(pPVar18);
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_38 = 0;
      psVar2 = __s->pPager->fd;
      psVar3 = psVar2->pMethods;
      if (psVar3 == (sqlite3_io_methods *)0x0) {
        uVar29 = 0;
      }
      else {
        uVar29 = (*psVar3->xRead)(psVar2,&local_98,100,0);
        if (uVar29 == 0x20a) {
          uVar29 = 0;
        }
      }
    }
    if (uVar29 != 0) goto LAB_001483d3;
    __s->openFlags = (u8)uVar21;
    __s->db = db;
    pPVar18 = __s->pPager;
    pPVar18->xBusyHandler = btreeInvokeBusyHandler;
    pPVar18->pBusyHandlerArg = __s;
    psVar3 = pPVar18->fd->pMethods;
    if (psVar3 != (sqlite3_io_methods *)0x0) {
      (*psVar3->xFileControl)(pPVar18->fd,0xf,&pPVar18->xBusyHandler);
    }
    p->pBt = __s;
    __s->pCursor = (BtCursor *)0x0;
    __s->pPage1 = (MemPage *)0x0;
    if (__s->pPager->readOnly != '\0') {
      *(byte *)&__s->btsFlags = (byte)__s->btsFlags | 1;
    }
    iVar6 = (int)((local_88 & 0xff) << 8);
    uVar10 = (uint)local_88._1_1_ * 0x10000 + iVar6;
    __s->pageSize = uVar10;
    if (((iVar6 + (uint)local_88._1_1_ * 0x10000) - 0x10001 < 0xffff01ff) ||
       ((uVar10 + 0x1ffff & uVar10) != 0)) {
      __s->pageSize = 0;
      uVar10 = 0;
      if (zFilename != (char *)0x0 && bVar5 == 0) {
        __s->autoVacuum = '\0';
        __s->incrVacuum = '\0';
        uVar10 = 0;
      }
    }
    else {
      uVar10 = (uint)local_88._4_1_;
      __s->btsFlags = __s->btsFlags | 2;
      __s->autoVacuum =
           ((local_68._4_4_ >> 0x18 != 0 || (local_68 & 0xff000000000000) != 0) ||
           (local_68 & 0xff0000000000) != 0) || (local_68 & 0xff00000000) != 0;
      __s->incrVacuum =
           (((uint)local_58 >> 0x18 != 0 || (local_58 & 0xff0000) != 0) || (local_58 & 0xff00) != 0)
           || (local_58 & 0xff) != 0;
    }
    uVar29 = sqlite3PagerSetPagesize(__s->pPager,&__s->pageSize,uVar10);
    if (uVar29 != 0) goto LAB_001483d3;
    __s->usableSize = __s->pageSize - uVar10;
    __s->nRef = 1;
    if (p->sharable == '\0') {
      uVar29 = 0;
      goto LAB_00147e82;
    }
    if (sqlite3Config.bCoreMutex == '\0') {
      psVar19 = (sqlite3_mutex *)0x0;
    }
    else {
      psVar19 = (*sqlite3Config.mutex.xMutexAlloc)(2);
    }
    if (sqlite3Config.bCoreMutex == '\0') {
LAB_00148bdd:
      if (psVar19 == (sqlite3_mutex *)0x0) {
        __s->pNext = sqlite3SharedCacheList;
        sqlite3SharedCacheList = __s;
      }
      else {
        (*sqlite3Config.mutex.xMutexEnter)(psVar19);
        __s->pNext = sqlite3SharedCacheList;
        sqlite3SharedCacheList = __s;
        (*sqlite3Config.mutex.xMutexLeave)(psVar19);
      }
      uVar29 = 0;
      bVar34 = true;
    }
    else {
      bVar34 = false;
      psVar20 = (*sqlite3Config.mutex.xMutexAlloc)(0);
      __s->mutex = psVar20;
      if (psVar20 != (sqlite3_mutex *)0x0) goto LAB_00148bdd;
      uVar29 = 7;
    }
    if (!bVar34) goto LAB_001483d3;
  }
LAB_00147e82:
  if ((p->sharable != '\0') && (0 < (long)db->nDb)) {
    lVar24 = 0;
    do {
      pBVar12 = *(Btree **)((long)&db->aDb->pBt + lVar24);
      if ((pBVar12 != (Btree *)0x0) && (pBVar12->sharable != '\0')) goto LAB_00147ecc;
      lVar24 = lVar24 + 0x20;
    } while ((long)db->nDb * 0x20 != lVar24);
  }
LAB_001483c8:
  *ppBtree = p;
LAB_001483d3:
  if (uVar29 == 0) {
    pvVar17 = sqlite3BtreeSchema(p,0,(_func_void_void_ptr *)0x0);
    if (pvVar17 == (void *)0x0) {
      sqlite3BtreeSetCacheSize(p,-2000);
    }
    psVar2 = __s->pPager->fd;
    psVar3 = psVar2->pMethods;
    if (psVar3 != (sqlite3_io_methods *)0x0) {
      (*psVar3->xFileControl)(psVar2,0x1e,&__s->db);
    }
  }
  else {
    if ((__s != (BtShared *)0x0) && (__s->pPager != (Pager *)0x0)) {
      sqlite3PagerClose(__s->pPager,(sqlite3 *)0x0);
    }
    sqlite3_free(__s);
    sqlite3_free(p);
    *ppBtree = (Btree *)0x0;
  }
  if (local_128 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(local_128);
  }
  return uVar29;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeOpen(
  sqlite3_vfs *pVfs,      /* VFS to use for this b-tree */
  const char *zFilename,  /* Name of the file containing the BTree database */
  sqlite3 *db,            /* Associated database handle */
  Btree **ppBtree,        /* Pointer to new Btree object written here */
  int flags,              /* Options */
  int vfsFlags            /* Flags passed through to sqlite3_vfs.xOpen() */
){
  BtShared *pBt = 0;             /* Shared part of btree structure */
  Btree *p;                      /* Handle to return */
  sqlite3_mutex *mutexOpen = 0;  /* Prevents a race condition. Ticket #3537 */
  int rc = SQLITE_OK;            /* Result code from this function */
  u8 nReserve;                   /* Byte of unused space on each page */
  unsigned char zDbHeader[100];  /* Database header content */

  /* True if opening an ephemeral, temporary database */
  const int isTempDb = zFilename==0 || zFilename[0]==0;

  /* Set the variable isMemdb to true for an in-memory database, or
  ** false for a file-based database.
  */
#ifdef SQLITE_OMIT_MEMORYDB
  const int isMemdb = 0;
#else
  const int isMemdb = (zFilename && strcmp(zFilename, ":memory:")==0)
                       || (isTempDb && sqlite3TempInMemory(db))
                       || (vfsFlags & SQLITE_OPEN_MEMORY)!=0;
#endif

  assert( db!=0 );
  assert( pVfs!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( (flags&0xff)==flags );   /* flags fit in 8 bits */

  /* Only a BTREE_SINGLE database can be BTREE_UNORDERED */
  assert( (flags & BTREE_UNORDERED)==0 || (flags & BTREE_SINGLE)!=0 );

  /* A BTREE_SINGLE database is always a temporary and/or ephemeral */
  assert( (flags & BTREE_SINGLE)==0 || isTempDb );

  if( isMemdb ){
    flags |= BTREE_MEMORY;
  }
  if( (vfsFlags & SQLITE_OPEN_MAIN_DB)!=0 && (isMemdb || isTempDb) ){
    vfsFlags = (vfsFlags & ~SQLITE_OPEN_MAIN_DB) | SQLITE_OPEN_TEMP_DB;
  }
  p = sqlite3MallocZero(sizeof(Btree));
  if( !p ){
    return SQLITE_NOMEM_BKPT;
  }
  p->inTrans = TRANS_NONE;
  p->db = db;
#ifndef SQLITE_OMIT_SHARED_CACHE
  p->lock.pBtree = p;
  p->lock.iTable = 1;
#endif

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /*
  ** If this Btree is a candidate for shared cache, try to find an
  ** existing BtShared object that we can share with
  */
  if( isTempDb==0 && (isMemdb==0 || (vfsFlags&SQLITE_OPEN_URI)!=0) ){
    if( vfsFlags & SQLITE_OPEN_SHAREDCACHE ){
      int nFilename = sqlite3Strlen30(zFilename)+1;
      int nFullPathname = pVfs->mxPathname+1;
      char *zFullPathname = sqlite3Malloc(MAX(nFullPathname,nFilename));
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )

      p->sharable = 1;
      if( !zFullPathname ){
        sqlite3_free(p);
        return SQLITE_NOMEM_BKPT;
      }
      if( isMemdb ){
        memcpy(zFullPathname, zFilename, nFilename);
      }else{
        rc = sqlite3OsFullPathname(pVfs, zFilename,
                                   nFullPathname, zFullPathname);
        if( rc ){
          if( rc==SQLITE_OK_SYMLINK ){
            rc = SQLITE_OK;
          }else{
            sqlite3_free(zFullPathname);
            sqlite3_free(p);
            return rc;
          }
        }
      }
#if SQLITE_THREADSAFE
      mutexOpen = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_OPEN);
      sqlite3_mutex_enter(mutexOpen);
      mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN);
      sqlite3_mutex_enter(mutexShared);
#endif
      for(pBt=GLOBAL(BtShared*,sqlite3SharedCacheList); pBt; pBt=pBt->pNext){
        assert( pBt->nRef>0 );
        if( 0==strcmp(zFullPathname, sqlite3PagerFilename(pBt->pPager, 0))
                 && sqlite3PagerVfs(pBt->pPager)==pVfs ){
          int iDb;
          for(iDb=db->nDb-1; iDb>=0; iDb--){
            Btree *pExisting = db->aDb[iDb].pBt;
            if( pExisting && pExisting->pBt==pBt ){
              sqlite3_mutex_leave(mutexShared);
              sqlite3_mutex_leave(mutexOpen);
              sqlite3_free(zFullPathname);
              sqlite3_free(p);
              return SQLITE_CONSTRAINT;
            }
          }
          p->pBt = pBt;
          pBt->nRef++;
          break;
        }
      }
      sqlite3_mutex_leave(mutexShared);
      sqlite3_free(zFullPathname);
    }
#ifdef SQLITE_DEBUG
    else{
      /* In debug mode, we mark all persistent databases as sharable
      ** even when they are not.  This exercises the locking code and
      ** gives more opportunity for asserts(sqlite3_mutex_held())
      ** statements to find locking problems.
      */
      p->sharable = 1;
    }
#endif
  }
#endif
  if( pBt==0 ){
    /*
    ** The following asserts make sure that structures used by the btree are
    ** the right size.  This is to guard against size changes that result
    ** when compiling on a different architecture.
    */
    assert( sizeof(i64)==8 );
    assert( sizeof(u64)==8 );
    assert( sizeof(u32)==4 );
    assert( sizeof(u16)==2 );
    assert( sizeof(Pgno)==4 );

    pBt = sqlite3MallocZero( sizeof(*pBt) );
    if( pBt==0 ){
      rc = SQLITE_NOMEM_BKPT;
      goto btree_open_out;
    }
    rc = sqlite3PagerOpen(pVfs, &pBt->pPager, zFilename,
                          sizeof(MemPage), flags, vfsFlags, pageReinit);
    if( rc==SQLITE_OK ){
      sqlite3PagerSetMmapLimit(pBt->pPager, db->szMmap);
      rc = sqlite3PagerReadFileheader(pBt->pPager,sizeof(zDbHeader),zDbHeader);
    }
    if( rc!=SQLITE_OK ){
      goto btree_open_out;
    }
    pBt->openFlags = (u8)flags;
    pBt->db = db;
    sqlite3PagerSetBusyHandler(pBt->pPager, btreeInvokeBusyHandler, pBt);
    p->pBt = pBt;

    pBt->pCursor = 0;
    pBt->pPage1 = 0;
    if( sqlite3PagerIsreadonly(pBt->pPager) ) pBt->btsFlags |= BTS_READ_ONLY;
#if defined(SQLITE_SECURE_DELETE)
    pBt->btsFlags |= BTS_SECURE_DELETE;
#elif defined(SQLITE_FAST_SECURE_DELETE)
    pBt->btsFlags |= BTS_OVERWRITE;
#endif
    /* EVIDENCE-OF: R-51873-39618 The page size for a database file is
    ** determined by the 2-byte integer located at an offset of 16 bytes from
    ** the beginning of the database file. */
    pBt->pageSize = (zDbHeader[16]<<8) | (zDbHeader[17]<<16);
    if( pBt->pageSize<512 || pBt->pageSize>SQLITE_MAX_PAGE_SIZE
         || ((pBt->pageSize-1)&pBt->pageSize)!=0 ){
      pBt->pageSize = 0;
#ifndef SQLITE_OMIT_AUTOVACUUM
      /* If the magic name ":memory:" will create an in-memory database, then
      ** leave the autoVacuum mode at 0 (do not auto-vacuum), even if
      ** SQLITE_DEFAULT_AUTOVACUUM is true. On the other hand, if
      ** SQLITE_OMIT_MEMORYDB has been defined, then ":memory:" is just a
      ** regular file-name. In this case the auto-vacuum applies as per normal.
      */
      if( zFilename && !isMemdb ){
        pBt->autoVacuum = (SQLITE_DEFAULT_AUTOVACUUM ? 1 : 0);
        pBt->incrVacuum = (SQLITE_DEFAULT_AUTOVACUUM==2 ? 1 : 0);
      }
#endif
      nReserve = 0;
    }else{
      /* EVIDENCE-OF: R-37497-42412 The size of the reserved region is
      ** determined by the one-byte unsigned integer found at an offset of 20
      ** into the database file header. */
      nReserve = zDbHeader[20];
      pBt->btsFlags |= BTS_PAGESIZE_FIXED;
#ifndef SQLITE_OMIT_AUTOVACUUM
      pBt->autoVacuum = (get4byte(&zDbHeader[36 + 4*4])?1:0);
      pBt->incrVacuum = (get4byte(&zDbHeader[36 + 7*4])?1:0);
#endif
    }
    rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize, nReserve);
    if( rc ) goto btree_open_out;
    pBt->usableSize = pBt->pageSize - nReserve;
    assert( (pBt->pageSize & 7)==0 );  /* 8-byte alignment of pageSize */

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
    /* Add the new BtShared object to the linked list sharable BtShareds.
    */
    pBt->nRef = 1;
    if( p->sharable ){
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )
      MUTEX_LOGIC( mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN);)
      if( SQLITE_THREADSAFE && sqlite3GlobalConfig.bCoreMutex ){
        pBt->mutex = sqlite3MutexAlloc(SQLITE_MUTEX_FAST);
        if( pBt->mutex==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto btree_open_out;
        }
      }
      sqlite3_mutex_enter(mutexShared);
      pBt->pNext = GLOBAL(BtShared*,sqlite3SharedCacheList);
      GLOBAL(BtShared*,sqlite3SharedCacheList) = pBt;
      sqlite3_mutex_leave(mutexShared);
    }
#endif
  }

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /* If the new Btree uses a sharable pBtShared, then link the new
  ** Btree into the list of all sharable Btrees for the same connection.
  ** The list is kept in ascending order by pBt address.
  */
  if( p->sharable ){
    int i;
    Btree *pSib;
    for(i=0; i<db->nDb; i++){
      if( (pSib = db->aDb[i].pBt)!=0 && pSib->sharable ){
        while( pSib->pPrev ){ pSib = pSib->pPrev; }
        if( (uptr)p->pBt<(uptr)pSib->pBt ){
          p->pNext = pSib;
          p->pPrev = 0;
          pSib->pPrev = p;
        }else{
          while( pSib->pNext && (uptr)pSib->pNext->pBt<(uptr)p->pBt ){
            pSib = pSib->pNext;
          }
          p->pNext = pSib->pNext;
          p->pPrev = pSib;
          if( p->pNext ){
            p->pNext->pPrev = p;
          }
          pSib->pNext = p;
        }
        break;
      }
    }
  }
#endif
  *ppBtree = p;

btree_open_out:
  if( rc!=SQLITE_OK ){
    if( pBt && pBt->pPager ){
      sqlite3PagerClose(pBt->pPager, 0);
    }
    sqlite3_free(pBt);
    sqlite3_free(p);
    *ppBtree = 0;
  }else{
    sqlite3_file *pFile;

    /* If the B-Tree was successfully opened, set the pager-cache size to the
    ** default value. Except, when opening on an existing shared pager-cache,
    ** do not change the pager-cache size.
    */
    if( sqlite3BtreeSchema(p, 0, 0)==0 ){
      sqlite3BtreeSetCacheSize(p, SQLITE_DEFAULT_CACHE_SIZE);
    }

    pFile = sqlite3PagerFile(pBt->pPager);
    if( pFile->pMethods ){
      sqlite3OsFileControlHint(pFile, SQLITE_FCNTL_PDB, (void*)&pBt->db);
    }
  }
  if( mutexOpen ){
    assert( sqlite3_mutex_held(mutexOpen) );
    sqlite3_mutex_leave(mutexOpen);
  }
  assert( rc!=SQLITE_OK || sqlite3BtreeConnectionCount(*ppBtree)>0 );
  return rc;
}